

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::NegativePartialUpdateTests::init(NegativePartialUpdateTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  NegativePartialUpdateTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0xa8);
  anon_unknown_0::NotPostableTest::NotPostableTest
            ((NotPostableTest *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa8);
  anon_unknown_0::NotCurrentSurfaceTest::NotCurrentSurfaceTest
            ((NotCurrentSurfaceTest *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa8);
  anon_unknown_0::BufferPreservedTest::BufferPreservedTest
            ((BufferPreservedTest *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa8);
  anon_unknown_0::SetTwiceTest::SetTwiceTest
            ((SetTwiceTest *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa8);
  anon_unknown_0::NoAgeTest::NoAgeTest((NoAgeTest *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa8);
  anon_unknown_0::PassNullTest::PassNullTest
            ((PassNullTest *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0xa8);
  anon_unknown_0::NotCurrentSurfaceTest2::NotCurrentSurfaceTest2
            ((NotCurrentSurfaceTest2 *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void NegativePartialUpdateTests::init (void)
{
	addChild(new NotPostableTest(m_eglTestCtx));
	addChild(new NotCurrentSurfaceTest(m_eglTestCtx));
	addChild(new BufferPreservedTest(m_eglTestCtx));
	addChild(new SetTwiceTest(m_eglTestCtx));
	addChild(new NoAgeTest(m_eglTestCtx));
	addChild(new PassNullTest(m_eglTestCtx));
	addChild(new NotCurrentSurfaceTest2(m_eglTestCtx));
}